

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_memory_buffer<char,_250UL,_std::allocator<char>_> * __thiscall
fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::operator=
          (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this,
          basic_memory_buffer<char,_250UL,_std::allocator<char>_> *other)

{
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *other_local;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_local;
  
  if (this != other) {
    deallocate(this);
    move(this,other);
    return this;
  }
  detail::assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/spdlog/fmt/bundled/format.h"
                      ,0x2ca,"");
}

Assistant:

basic_memory_buffer& operator=(basic_memory_buffer&& other) FMT_NOEXCEPT {
    FMT_ASSERT(this != &other, "");
    deallocate();
    move(other);
    return *this;
  }